

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void multi_done_locked(connectdata *conn,Curl_easy *data,void *userdata)

{
  undefined1 *puVar1;
  byte bVar2;
  uint uVar3;
  curl_trc_feat *pcVar4;
  ConnectBits CVar5;
  undefined8 uVar6;
  curl_off_t cVar7;
  _Bool _Var8;
  uint uVar9;
  long lVar10;
  
  Curl_detach_connection(data);
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))) &&
     (0 < Curl_trc_feat_multi.log_level)) {
    uVar9 = Curl_uint_spbset_count(&conn->xfers_attached);
    Curl_trc_multi(data,"multi_done_locked, in use=%u",(ulong)uVar9);
  }
  _Var8 = Curl_uint_spbset_empty(&conn->xfers_attached);
  if (_Var8) {
    puVar1 = &(data->state).field_0x7bf;
    *puVar1 = *puVar1 | 0x10;
    (data->state).recent_conn_id = conn->connection_id;
    if (conn->dns_entry != (Curl_dns_entry *)0x0) {
      Curl_resolv_unlink(data,&conn->dns_entry);
    }
    Curl_dnscache_prune(data);
    uVar9 = (uint)*(undefined8 *)&(data->set).field_0x89c;
    if (((((int)uVar9 < 0) && (conn->http_ntlm_state != NTLMSTATE_TYPE2)) &&
        (conn->proxy_ntlm_state != NTLMSTATE_TYPE2)) || (((ulong)conn->bits & 0x20) != 0)) {
LAB_00146c98:
      if ((((uVar9 >> 0x1e & 1) != 0) &&
          ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))
          ) && (0 < Curl_trc_feat_multi.log_level)) {
        cVar7 = conn->connection_id;
        uVar3 = *(uint *)&conn->bits;
        bVar2 = *userdata;
        _Var8 = Curl_conn_is_multiplex(conn,0);
        Curl_trc_multi(data,
                       "multi_done, not reusing connection=%ld, forbid=%d, close=%d, premature=%d, conn_multiplex=%d"
                       ,cVar7,(ulong)(uVar9 >> 0x1f),(ulong)(uVar3 >> 5 & 1),(ulong)(bVar2 & 1),
                       (uint)_Var8);
      }
      Curl_conncontrol(conn,1);
      Curl_conn_terminate(data,conn,(_Bool)(*userdata & 1));
      return;
    }
    if ((*userdata & 1) != 0) {
      _Var8 = Curl_conn_is_multiplex(conn,0);
      if (!_Var8) {
        uVar9 = (uint)*(undefined8 *)&(data->set).field_0x89c;
        goto LAB_00146c98;
      }
    }
    _Var8 = Curl_cpool_conn_now_idle(data,conn);
    if (_Var8) {
      CVar5 = conn->bits;
      lVar10 = 0x108;
      if (((((ulong)CVar5 & 2) == 0) && (lVar10 = 0x140, ((ulong)CVar5 & 1) == 0)) &&
         (lVar10 = 0xe8, (CVar5._0_4_ >> 8 & 1) == 0)) {
        lVar10 = 0xb8;
      }
      uVar6 = *(undefined8 *)((long)&(conn->cpool_node)._list + lVar10);
      cVar7 = conn->connection_id;
      (data->state).lastconnect_id = cVar7;
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
      {
        Curl_infof(data,"Connection #%ld to host %s left intact",cVar7,uVar6);
        return;
      }
    }
    else {
      (data->state).lastconnect_id = -1;
    }
  }
  else if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) && (0 < Curl_trc_feat_multi.log_level)) {
    uVar9 = Curl_uint_spbset_count(&conn->xfers_attached);
    Curl_trc_multi(data,"Connection still in use %u, no more multi_done now!",(ulong)uVar9);
    return;
  }
  return;
}

Assistant:

static void multi_done_locked(struct connectdata *conn,
                              struct Curl_easy *data,
                              void *userdata)
{
  struct multi_done_ctx *mdctx = userdata;

  Curl_detach_connection(data);

  CURL_TRC_M(data, "multi_done_locked, in use=%u",
             Curl_uint_spbset_count(&conn->xfers_attached));
  if(CONN_INUSE(conn)) {
    /* Stop if still used. */
    CURL_TRC_M(data, "Connection still in use %u, no more multi_done now!",
               Curl_uint_spbset_count(&conn->xfers_attached));
    return;
  }

  data->state.done = TRUE; /* called just now! */
  data->state.recent_conn_id = conn->connection_id;

  if(conn->dns_entry)
    Curl_resolv_unlink(data, &conn->dns_entry); /* done with this */
  Curl_dnscache_prune(data);

  /* if data->set.reuse_forbid is TRUE, it means the libcurl client has
     forced us to close this connection. This is ignored for requests taking
     place in a NTLM/NEGOTIATE authentication handshake

     if conn->bits.close is TRUE, it means that the connection should be
     closed in spite of all our efforts to be nice, due to protocol
     restrictions in our or the server's end

     if premature is TRUE, it means this connection was said to be DONE before
     the entire request operation is complete and thus we cannot know in what
     state it is for reusing, so we are forced to close it. In a perfect world
     we can add code that keep track of if we really must close it here or not,
     but currently we have no such detail knowledge.
  */

  if((data->set.reuse_forbid
#if defined(USE_NTLM)
      && !(conn->http_ntlm_state == NTLMSTATE_TYPE2 ||
           conn->proxy_ntlm_state == NTLMSTATE_TYPE2)
#endif
#if defined(USE_SPNEGO)
      && !(conn->http_negotiate_state == GSS_AUTHRECV ||
           conn->proxy_negotiate_state == GSS_AUTHRECV)
#endif
     ) || conn->bits.close
       || (mdctx->premature && !Curl_conn_is_multiplex(conn, FIRSTSOCKET))) {
    CURL_TRC_M(data, "multi_done, not reusing connection=%"
                     FMT_OFF_T ", forbid=%d"
                     ", close=%d, premature=%d, conn_multiplex=%d",
                     conn->connection_id, data->set.reuse_forbid,
                     conn->bits.close, mdctx->premature,
                     Curl_conn_is_multiplex(conn, FIRSTSOCKET));
    connclose(conn, "disconnecting");
    Curl_conn_terminate(data, conn, mdctx->premature);
  }
  else {
    /* the connection is no longer in use by any transfer */
    if(Curl_cpool_conn_now_idle(data, conn)) {
      /* connection kept in the cpool */
      const char *host =
#ifndef CURL_DISABLE_PROXY
        conn->bits.socksproxy ?
        conn->socks_proxy.host.dispname :
        conn->bits.httpproxy ? conn->http_proxy.host.dispname :
#endif
        conn->bits.conn_to_host ? conn->conn_to_host.dispname :
        conn->host.dispname;
      data->state.lastconnect_id = conn->connection_id;
      infof(data, "Connection #%" FMT_OFF_T " to host %s left intact",
            conn->connection_id, host);
    }
    else {
      /* connection was removed from the cpool and destroyed. */
      data->state.lastconnect_id = -1;
    }
  }
}